

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall EventLoop::doPendingFunctors(EventLoop *this)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_38;
  
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->callingPendingFunctors_ = true;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  pfVar1 = (this->pendingFunctors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->pendingFunctors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pfVar3 = (this->pendingFunctors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->pendingFunctors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->pendingFunctors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->pendingFunctors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pfVar1;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pfVar2;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pfVar3;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  if (local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (*(long *)((long)&((local_38.
                             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                           _M_manager + lVar5) == 0) {
        uVar4 = std::__throw_bad_function_call();
        std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                  (&local_38);
        _Unwind_Resume(uVar4);
      }
      (**(code **)((long)&(local_38.
                           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_invoker + lVar5))
                ((long)&((local_38.
                          super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                        _M_functor + lVar5);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < (ulong)((long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this->callingPendingFunctors_ = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_38);
  return;
}

Assistant:

void EventLoop::doPendingFunctors(){
    std::vector<Functor> functors;
    callingPendingFunctors_ = true;

    {
        MutexLockGuard lock(mutex_);
        functors.swap(pendingFunctors_);
    }

    for (size_t i = 0; i < functors.size(); i++)
    {
        functors[i]();
    }
    callingPendingFunctors_ = false;
}